

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cc
# Opt level: O1

int x509_digest_sign_algorithm(EVP_MD_CTX *ctx,X509_ALGOR *algor)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  EVP_PKEY *pkey;
  ASN1_OBJECT *aobj;
  EVP_MD *md;
  int unaff_EBP;
  uint ptype;
  int sign_nid;
  int pad_mode;
  undefined8 local_28;
  
  local_28 = in_RAX;
  pkey = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)ctx->pctx);
  if (pkey == (EVP_PKEY *)0x0) {
    iVar2 = 0x6c;
    iVar3 = 0x26;
  }
  else {
    iVar2 = EVP_PKEY_id(pkey);
    if (iVar2 == 6) {
      iVar2 = EVP_PKEY_CTX_get_rsa_padding(ctx->pctx,(int *)((long)&local_28 + 4));
      if (iVar2 == 0) {
        bVar1 = false;
        unaff_EBP = 0;
      }
      else if (local_28._4_4_ == 6) {
        unaff_EBP = x509_rsa_ctx_to_pss(ctx,algor);
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
      if (!bVar1) {
        return unaff_EBP;
      }
    }
    iVar2 = EVP_PKEY_id(pkey);
    if (iVar2 == 0x3b5) {
      aobj = OBJ_nid2obj(0x3b5);
      ptype = 0xffffffff;
LAB_00218ec9:
      iVar2 = X509_ALGOR_set0((X509_ALGOR *)algor,aobj,ptype,(void *)0x0);
      return iVar2;
    }
    md = (EVP_MD *)EVP_MD_CTX_get0_md(ctx);
    if (md == (EVP_MD *)0x0) {
      iVar2 = 0x6c;
      iVar3 = 0x3d;
    }
    else {
      iVar2 = EVP_MD_type(md);
      if ((iVar2 != 4) && (iVar2 != 0x101)) {
        iVar3 = EVP_PKEY_id(pkey);
        iVar2 = OBJ_find_sigid_by_algs((int *)&local_28,iVar2,iVar3);
        if (iVar2 != 0) {
          iVar2 = EVP_PKEY_id(pkey);
          ptype = -(uint)(iVar2 != 6) | 5;
          aobj = OBJ_nid2obj((int)local_28);
          goto LAB_00218ec9;
        }
      }
      iVar2 = 0x6f;
      iVar3 = 0x45;
    }
  }
  ERR_put_error(0xc,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/algorithm.cc"
                ,iVar3);
  return 0;
}

Assistant:

int x509_digest_sign_algorithm(EVP_MD_CTX *ctx, X509_ALGOR *algor) {
  EVP_PKEY *pkey = EVP_PKEY_CTX_get0_pkey(ctx->pctx);
  if (pkey == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_CONTEXT_NOT_INITIALISED);
    return 0;
  }

  if (EVP_PKEY_id(pkey) == EVP_PKEY_RSA) {
    int pad_mode;
    if (!EVP_PKEY_CTX_get_rsa_padding(ctx->pctx, &pad_mode)) {
      return 0;
    }
    // RSA-PSS has special signature algorithm logic.
    if (pad_mode == RSA_PKCS1_PSS_PADDING) {
      return x509_rsa_ctx_to_pss(ctx, algor);
    }
  }

  if (EVP_PKEY_id(pkey) == EVP_PKEY_ED25519) {
    return X509_ALGOR_set0(algor, OBJ_nid2obj(NID_ED25519), V_ASN1_UNDEF, NULL);
  }

  // Default behavior: look up the OID for the algorithm/hash pair and encode
  // that.
  const EVP_MD *digest = EVP_MD_CTX_get0_md(ctx);
  if (digest == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_CONTEXT_NOT_INITIALISED);
    return 0;
  }

  const int digest_nid = EVP_MD_type(digest);
  int sign_nid;
  if (!x509_digest_nid_ok(digest_nid) ||
      !OBJ_find_sigid_by_algs(&sign_nid, digest_nid, EVP_PKEY_id(pkey))) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DIGEST_AND_KEY_TYPE_NOT_SUPPORTED);
    return 0;
  }

  // RSA signature algorithms include an explicit NULL parameter. Others omit
  // it.
  int paramtype =
      (EVP_PKEY_id(pkey) == EVP_PKEY_RSA) ? V_ASN1_NULL : V_ASN1_UNDEF;
  return X509_ALGOR_set0(algor, OBJ_nid2obj(sign_nid), paramtype, NULL);
}